

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Shift(ShiftForm4 Shift)

{
  uint uVar1;
  value_type vVar2;
  value_type vVar3;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  byte bVar4;
  uint32_t uVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  code *in_RDI;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  double shiftY;
  double shiftX;
  double maxShiftY;
  double maxShiftX;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd44;
  uint8_t in_stack_fffffffffffffd46;
  uint8_t in_stack_fffffffffffffd47;
  uint32_t in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffd50;
  Image *in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd64;
  uint32_t in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  uint8_t value;
  value_type vVar14;
  uint32_t in_stack_fffffffffffffd94;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffda0;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  uint32_t *in_stack_fffffffffffffda8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb8;
  size_type sVar15;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffdc0;
  value_type local_1f0;
  value_type local_1d0;
  undefined1 **local_198;
  uint32_t local_148;
  uint32_t local_144;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  undefined1 local_109;
  undefined8 *local_a8;
  undefined1 *local_a0 [5];
  undefined1 local_78 [40];
  undefined8 *local_50;
  undefined8 local_48;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffd3c);
  local_109 = 1;
  local_a8 = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd47,in_stack_fffffffffffffd46);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd6c >> 0x18),in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd64,in_stack_fffffffffffffd58);
  local_a8 = (undefined8 *)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd47,in_stack_fffffffffffffd46);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd6c >> 0x18),in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd64,in_stack_fffffffffffffd58);
  local_109 = 0;
  local_50 = local_a0;
  local_48 = 2;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e2406);
  __l._M_len._0_4_ = in_stack_fffffffffffffd80;
  __l._M_array = (iterator)in_stack_fffffffffffffd78;
  __l._M_len._4_4_ = in_stack_fffffffffffffd84;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffd70,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1e243a);
  local_198 = (undefined1 **)&local_50;
  do {
    local_198 = local_198 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1e246f);
    auVar13 = in_ZMM0._0_16_;
  } while (local_198 != local_a0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2499);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e24a6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e24bb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e24d0);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,0);
  uVar1 = *pvVar6;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar7);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,0);
  if (uVar1 < (uVar5 - local_144) - *pvVar6) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,0);
    local_1d0 = *pvVar6;
  }
  else {
    pvVar7 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](&local_40,0);
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar7);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,0);
    local_1d0 = (uVar5 - local_144) - *pvVar6;
  }
  auVar13 = vcvtusi2sd_avx512f(auVar13,local_1d0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,0);
  uVar1 = *pvVar6;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_40,0);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar7);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,0);
  if (uVar1 < (uVar5 - local_148) - *pvVar6) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,0);
    local_1f0 = *pvVar6;
  }
  else {
    pvVar7 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](&local_40,0);
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar7);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,0);
    local_1f0 = (uVar5 - local_148) - *pvVar6;
  }
  vcvtusi2sd_avx512f(auVar13,local_1f0);
  dVar9 = Unit_Test::randomFloatValue<double>
                    ((double)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     (double)CONCAT17(in_stack_fffffffffffffd47,
                                      CONCAT16(in_stack_fffffffffffffd46,
                                               CONCAT24(in_stack_fffffffffffffd44,
                                                        in_stack_fffffffffffffd40))),
                     (double)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  dVar10 = Unit_Test::randomFloatValue<double>
                     ((double)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (double)CONCAT17(in_stack_fffffffffffffd47,
                                       CONCAT16(in_stack_fffffffffffffd46,
                                                CONCAT24(in_stack_fffffffffffffd44,
                                                         in_stack_fffffffffffffd40))),
                      (double)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  dVar11 = Unit_Test::randomFloatValue<double>
                     ((double)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (double)CONCAT17(in_stack_fffffffffffffd47,
                                       CONCAT16(in_stack_fffffffffffffd46,
                                                CONCAT24(in_stack_fffffffffffffd44,
                                                         in_stack_fffffffffffffd40))),
                      (double)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  dVar12 = Unit_Test::randomFloatValue<double>
                     ((double)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (double)CONCAT17(in_stack_fffffffffffffd47,
                                       CONCAT16(in_stack_fffffffffffffd46,
                                                CONCAT24(in_stack_fffffffffffffd44,
                                                         in_stack_fffffffffffffd40))),
                      (double)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  image_00 = (Image *)0x0;
  this = &local_40;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  this_00 = &local_128;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(size_type)image_00);
  vVar14 = *pvVar6;
  this_01 = &local_140;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_01,(size_type)image_00);
  vVar2 = *pvVar6;
  sVar15 = 1;
  pvVar8 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar15);
  vVar3 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar15);
  (*local_10)(dVar9 + dVar10,dVar11 + dVar12,pvVar7,vVar14,vVar2,pvVar8,vVar3,*pvVar6,local_144,
              local_148);
  sVar15 = 1;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_40,1);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_128,sVar15);
  value = (uint8_t)(*pvVar6 >> 0x18);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,sVar15);
  vVar14 = *pvVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  bVar4 = Unit_Test::verifyImage
                    (image_00,in_stack_fffffffffffffd94,local_148,local_144,vVar14,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd50);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffd50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd50);
  return (bool)(bVar4 & 1);
}

Assistant:

bool form4_Shift(ShiftForm4 Shift)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const double maxShiftX = roiX[0] < (image[0].width()  - roiWidth  - roiX[0]) ? roiX[0] : (image[0].width()  - roiWidth  - roiX[0]);
        const double maxShiftY = roiY[0] < (image[0].height() - roiHeight - roiY[0]) ? roiY[0] : (image[0].height() - roiHeight - roiY[0]);
        const double shiftX = randomFloatValue<double>( -maxShiftX / 4, maxShiftX / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -maxShiftY / 4 , maxShiftY / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        Shift( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], roiWidth, roiHeight, shiftX, shiftY );

        return verifyImage( image[1], roiX[1], roiY[1], roiWidth, roiHeight, intensity[0] );
    }